

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

boolean emergency_disrobe(boolean *lostsome)

{
  int iVar1;
  int local_34;
  obj *poStack_30;
  int i;
  obj *otmp;
  obj *obj;
  int invc;
  boolean *lostsome_local;
  
  obj._4_4_ = inv_cnt();
  do {
    iVar1 = near_capacity();
    if (iVar1 <= (int)(uint)(uball == (obj *)0x0)) {
      return '\x01';
    }
    poStack_30 = (obj *)0x0;
    if (0 < obj._4_4_) {
      local_34 = rn2(obj._4_4_);
      for (otmp = invent; otmp != (obj *)0x0; otmp = otmp->nobj) {
        if (((((((otmp->otyp != 0x210) || ((*(uint *)&otmp->field_0x4a & 1) == 0)) &&
               (otmp != uamul)) && ((otmp != uleft && (otmp != uright)))) &&
             ((otmp != ublindf && ((otmp != uarm && (otmp != uarmc)))))) && (otmp != uarmg)) &&
           ((((otmp != uarmf && (otmp != uarmu)) &&
             (((*(uint *)&otmp->field_0x4a & 1) == 0 || ((otmp != uarmh && (otmp != uarms)))))) &&
            (iVar1 = welded(otmp), iVar1 == 0)))) {
          poStack_30 = otmp;
        }
        local_34 = local_34 + -1;
        if ((local_34 < 0) && (poStack_30 != (obj *)0x0)) break;
      }
    }
    if (poStack_30 == (obj *)0x0) {
      return '\0';
    }
    if (poStack_30->owornmask != 0) {
      remove_worn_item(poStack_30,'\0');
    }
    *lostsome = '\x01';
    dropx(poStack_30);
    obj._4_4_ = obj._4_4_ + -1;
  } while( true );
}

Assistant:

static boolean emergency_disrobe(boolean *lostsome)
{
	int invc = inv_cnt();

	while (near_capacity() > (Punished ? UNENCUMBERED : SLT_ENCUMBER)) {
	    struct obj *obj, *otmp = NULL;
	    int i;

	    /* Pick a random object */
	    if (invc > 0) {
		i = rn2(invc);
		for (obj = invent; obj; obj = obj->nobj) {
		    /*
		     * Undroppables are: body armor, boots, gloves,
		     * amulets, and rings because of the time and effort
		     * in removing them + loadstone and other cursed stuff
		     * for obvious reasons.
		     */
		    if (!((obj->otyp == LOADSTONE && obj->cursed) ||
			  obj == uamul || obj == uleft || obj == uright ||
			  obj == ublindf || obj == uarm || obj == uarmc ||
			  obj == uarmg || obj == uarmf || obj == uarmu ||
			  (obj->cursed && (obj == uarmh || obj == uarms)) ||
			  welded(obj)))
			otmp = obj;
		    /* reached the mark and found some stuff to drop? */
		    if (--i < 0 && otmp) break;

		    /* else continue */
		}
	    }
	    if (!otmp)
		return FALSE; /* nothing to drop! */

	    if (otmp->owornmask) remove_worn_item(otmp, FALSE);
	    *lostsome = TRUE;
	    dropx(otmp);
	    invc--;
	}
	return TRUE;
}